

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamIndexFactory_p.cpp
# Opt level: O2

string * BamTools::Internal::BamIndexFactory::FileExtension
                   (string *__return_storage_ptr__,string *filename)

{
  long lVar1;
  
  if ((4 < filename->_M_string_length) &&
     (lVar1 = std::__cxx11::string::rfind((char)filename,0x2e), lVar1 != -1)) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

const std::string BamIndexFactory::FileExtension(const std::string& filename)
{

    // if filename cannot contain valid path + extension, return empty string
    if (filename.empty() || filename.length() <= 4) return std::string();

    // look for last dot in filename
    const std::size_t lastDotPosition = filename.find_last_of('.');

    // if none found, return empty string
    if (lastDotPosition == std::string::npos) return std::string();

    // return substring from last dot position
    return filename.substr(lastDotPosition);
}